

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type_resolver_util.cc
# Opt level: O1

void google::protobuf::util::anon_unknown_0::ConvertEnumDescriptor
               (EnumDescriptor *descriptor,Enum *enum_type)

{
  Edition EVar1;
  SourceContext *pSVar2;
  EnumValueDescriptor *pEVar3;
  void *pvVar4;
  Arena *pAVar5;
  int iVar6;
  
  Enum::Clear(enum_type);
  EVar1 = FileDescriptor::edition(descriptor->file_);
  iVar6 = 0;
  if (EVar1 != EDITION_PROTO2) {
    iVar6 = (EVar1 != EDITION_PROTO3) + 1;
  }
  (enum_type->field_0)._impl_.syntax_ = iVar6;
  pAVar5 = (Arena *)(enum_type->super_Message).super_MessageLite._internal_metadata_.ptr_;
  if (((ulong)pAVar5 & 1) != 0) {
    pAVar5 = *(Arena **)((ulong)pAVar5 & 0xfffffffffffffffe);
  }
  internal::ArenaStringPtr::Set<>
            (&(enum_type->field_0)._impl_.name_,descriptor->all_names_ + 1,pAVar5);
  *(byte *)&enum_type->field_0 = *(byte *)&enum_type->field_0 | 1;
  if ((enum_type->field_0)._impl_.source_context_ == (SourceContext *)0x0) {
    pAVar5 = (Arena *)(enum_type->super_Message).super_MessageLite._internal_metadata_.ptr_;
    if (((ulong)pAVar5 & 1) != 0) {
      pAVar5 = *(Arena **)((ulong)pAVar5 & 0xfffffffffffffffe);
    }
    pSVar2 = (SourceContext *)Arena::DefaultConstruct<google::protobuf::SourceContext>(pAVar5);
    (enum_type->field_0)._impl_.source_context_ = pSVar2;
  }
  pSVar2 = (enum_type->field_0)._impl_.source_context_;
  pAVar5 = (Arena *)(pSVar2->super_Message).super_MessageLite._internal_metadata_.ptr_;
  if (((ulong)pAVar5 & 1) != 0) {
    pAVar5 = *(Arena **)((ulong)pAVar5 & 0xfffffffffffffffe);
  }
  internal::ArenaStringPtr::Set<>
            (&(pSVar2->field_0)._impl_.file_name_,descriptor->file_->name_,pAVar5);
  if (0 < descriptor->value_count_) {
    iVar6 = 0;
    do {
      pEVar3 = EnumDescriptor::value(descriptor,iVar6);
      pvVar4 = internal::RepeatedPtrFieldBase::AddMessageLite
                         (&(enum_type->field_0)._impl_.enumvalue_.super_RepeatedPtrFieldBase,
                          Arena::DefaultConstruct<google::protobuf::EnumValue>);
      pAVar5 = *(Arena **)((long)pvVar4 + 8);
      if (((ulong)pAVar5 & 1) != 0) {
        pAVar5 = *(Arena **)((ulong)pAVar5 & 0xfffffffffffffffe);
      }
      internal::ArenaStringPtr::Set<>
                ((ArenaStringPtr *)((long)pvVar4 + 0x28),pEVar3->all_names_,pAVar5);
      *(int *)((long)pvVar4 + 0x30) = pEVar3->number_;
      ConvertOptionsInternal
                (&pEVar3->options_->super_Message,
                 (RepeatedPtrField<google::protobuf::Option> *)((long)pvVar4 + 0x10));
      iVar6 = iVar6 + 1;
    } while (iVar6 < descriptor->value_count_);
  }
  ConvertOptionsInternal(&descriptor->options_->super_Message,&(enum_type->field_0)._impl_.options_)
  ;
  return;
}

Assistant:

void ConvertEnumDescriptor(const EnumDescriptor& descriptor, Enum* enum_type) {
  enum_type->Clear();
  enum_type->set_syntax(
      ConvertSyntax(FileDescriptorLegacy(descriptor.file()).edition()));

  enum_type->set_name(descriptor.full_name());
  enum_type->mutable_source_context()->set_file_name(descriptor.file()->name());
  for (int i = 0; i < descriptor.value_count(); ++i) {
    const EnumValueDescriptor& value_descriptor = *descriptor.value(i);
    EnumValue* value = enum_type->mutable_enumvalue()->Add();
    value->set_name(value_descriptor.name());
    value->set_number(value_descriptor.number());

    ConvertEnumValueOptions(value_descriptor.options(),
                            *value->mutable_options());
  }

  ConvertEnumOptions(descriptor.options(), *enum_type->mutable_options());
}